

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

TemporaryFileIndex * __thiscall
duckdb::TemporaryFileHandle::TryGetBlockIndex
          (TemporaryFileIndex *__return_storage_ptr__,TemporaryFileHandle *this)

{
  lock_guard<std::mutex> in_RAX;
  idx_t block_index_p;
  mutex *mutex;
  TemporaryFileLock lock;
  TemporaryFileLock local_18;
  
  mutex = &this->file_lock;
  local_18.lock._M_device = (lock_guard<std::mutex>)(lock_guard<std::mutex>)in_RAX._M_device;
  TemporaryFileLock::TemporaryFileLock(&local_18,mutex);
  if (((this->index_manager).max_index < this->max_allowed_index) ||
     ((this->index_manager).free_indexes._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    CreateFileIfNotExists(this,(TemporaryFileLock *)mutex);
    block_index_p =
         BlockIndexManager::GetNewBlockIndex(&this->index_manager,(this->identifier).size);
    TemporaryFileIndex::TemporaryFileIndex(__return_storage_ptr__,this->identifier,block_index_p);
  }
  else {
    TemporaryFileIndex::TemporaryFileIndex(__return_storage_ptr__);
  }
  pthread_mutex_unlock((pthread_mutex_t *)local_18.lock._M_device);
  return __return_storage_ptr__;
}

Assistant:

TemporaryFileIndex TemporaryFileHandle::TryGetBlockIndex() {
	TemporaryFileLock lock(file_lock);
	if (index_manager.GetMaxIndex() >= max_allowed_index && index_manager.HasFreeBlocks()) {
		// file is at capacity
		return TemporaryFileIndex();
	}
	// open the file handle if it does not yet exist
	CreateFileIfNotExists(lock);
	// fetch a new block index to write to
	auto block_index = index_manager.GetNewBlockIndex(identifier.size);
	return TemporaryFileIndex(identifier, block_index);
}